

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O3

int __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::unlink
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,char *__name)

{
  long lVar1;
  LinkType LVar2;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long v;
  bool bVar7;
  LinkType nilParent;
  LinkType local_58;
  ulong local_50;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = -1;
  lVar3 = this[2].rootNode[1];
  if (__name == (char *)0xffffffffffffffff) {
    bVar7 = true;
  }
  else {
    bVar7 = -1 < *(long *)(lVar3 + 0x70 + (long)__name * 0x90);
  }
  lVar6 = (long)__name * 0x90;
  lVar5 = *(long *)(lVar3 + 0x60 + lVar6);
  v = *(long *)(lVar3 + 0x68 + lVar6);
  if (lVar5 == -1) {
    transplant(this,(LinkType)__name,v,&local_58);
    lVar3 = extraout_RAX;
LAB_002cd455:
    if (!bVar7) goto LAB_002cd468;
  }
  else {
    if (v == -1) {
      transplant(this,(LinkType)__name,lVar5,&local_58);
      lVar3 = extraout_RAX_00;
      v = lVar5;
      goto LAB_002cd455;
    }
    do {
      lVar4 = v;
      lVar5 = lVar4 * 0x90;
      v = *(long *)(lVar3 + 0x60 + lVar5);
    } while (v != -1);
    v = *(long *)(lVar3 + 0x68 + lVar5);
    local_38 = *(ulong *)(lVar3 + 0x70 + lVar5);
    local_40 = 0x7fffffffffffffff;
    local_48 = this;
    if ((char *)((local_38 & 0x7fffffffffffffff) - 1) == __name) {
      lVar1 = v;
      LVar2 = lVar4;
      if (v != -1) goto LAB_002cd4a3;
    }
    else {
      transplant(this,lVar4,v,&local_58);
      lVar3 = local_48[2].rootNode[1];
      lVar1 = *(long *)(lVar3 + 0x68 + lVar6);
      *(long *)(lVar3 + 0x68 + lVar5) = lVar1;
LAB_002cd4a3:
      *(ulong *)(lVar3 + 0x70 + lVar1 * 0x90) =
           *(ulong *)(lVar3 + 0x70 + lVar1 * 0x90) & 0x8000000000000000 | lVar4 + 1U;
      LVar2 = local_58;
    }
    local_58 = LVar2;
    local_50 = lVar4 + 1;
    transplant(local_48,(LinkType)__name,lVar4,&local_58);
    lVar3 = local_48[2].rootNode[1];
    lVar4 = *(long *)(lVar3 + 0x60 + lVar6);
    *(long *)(lVar3 + 0x60 + lVar5) = lVar4;
    lVar4 = lVar4 * 0x90;
    *(ulong *)(lVar3 + 0x70 + lVar4) =
         *(ulong *)(lVar3 + 0x70 + lVar4) & 0x8000000000000000 | local_50;
    *(ulong *)(lVar3 + 0x70 + lVar5) =
         *(ulong *)(lVar3 + 0x70 + lVar6) & 0x8000000000000000 |
         local_40 & *(ulong *)(lVar3 + 0x70 + lVar5);
    this = local_48;
    if ((long)local_38 < 0) goto LAB_002cd468;
  }
  deleteFixup(this,v,local_58);
  lVar3 = extraout_RAX_01;
LAB_002cd468:
  return (int)lVar3;
}

Assistant:

void unlink(LinkType z) {
    LinkType nilParent = kNoLink;
    LinkType y = z;
    bool yWasBlack = isBlack(y);
    LinkType x;

    if (getChild(z, kLeft) == kNoLink) {
      x = getChild(z, kRight);
      transplant(z, x, nilParent);
    } else if (getChild(z, kRight) == kNoLink) {
      x = getChild(z, kLeft);
      transplant(z, x, nilParent);
    } else {
      y = first(getChild(z, kRight));
      yWasBlack = isBlack(y);
      x = getChild(y, kRight);
      if (getParent(y) == z) {
        if (x == kNoLink)
          nilParent = y;
        else
          setParent(x, y);
      } else {
        transplant(y, getChild(y, kRight), nilParent);
        LinkType zRight = getChild(z, kRight);
        setChild(y, kRight, zRight);
        setParent(zRight, y);
      }
      transplant(z, y, nilParent);
      LinkType zLeft = getChild(z, kLeft);
      setChild(y, kLeft, zLeft);
      setParent(zLeft, y);
      setColor(y, getColor(z));
    }

    if (yWasBlack) deleteFixup(x, nilParent);
  }